

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O0

void __thiscall hello::view_test(hello *this,string *skin)

{
  ulong uVar1;
  string *psVar2;
  undefined8 in_RDI;
  hello c;
  hello *this_00;
  allocator<char> local_1549;
  string local_1548 [24];
  hello *in_stack_ffffffffffffead0;
  undefined1 local_1518 [5400];
  
  view::hello::hello(in_stack_ffffffffffffead0);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    psVar2 = (string *)cppcms::application::context();
    cppcms::http::context::skin(psVar2);
  }
  this_00 = (hello *)&local_1549;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1548,"hello",(allocator *)this_00);
  cppcms::application::render(in_RDI,local_1548,local_1518);
  std::__cxx11::string::~string(local_1548);
  std::allocator<char>::~allocator(&local_1549);
  view::hello::~hello(this_00);
  return;
}

Assistant:

void view_test(std::string skin)
	{
		view::hello c;
		if(!skin.empty())
			context().skin(skin);
		render("hello",c);
	}